

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_aa32_ld_i64(DisasContext_conflict1 *s,TCGv_i64 val,TCGv_i32 a32,int index,MemOp opc)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 addr;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  addr = gen_aa32_addr(s,a32,opc);
  tcg_gen_qemu_ld_i64_aarch64(tcg_ctx,val,addr,(ulong)(uint)index,opc);
  if (((s->uc->mode & UC_MODE_ARMBE8) != UC_MODE_ARM) && (s->sctlr_b != 0)) {
    tcg_gen_rotri_i64_aarch64(s->uc->tcg_ctx,val,val,0x20);
  }
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(addr + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_aa32_ld_i64(DisasContext *s, TCGv_i64 val, TCGv_i32 a32,
                            int index, MemOp opc)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv addr = gen_aa32_addr(s, a32, opc);
    tcg_gen_qemu_ld_i64(tcg_ctx, val, addr, index, opc);
    gen_aa32_frob64(s, val);
    tcg_temp_free(tcg_ctx, addr);
}